

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O2

void __thiscall
ASCFile::ASCFile(ASCFile *this,vector<char,_std::allocator<char>_> *buf,path *filepath)

{
  bool bVar1;
  char *__locale;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  path local_c0;
  path directory;
  error_code ec;
  string local_60;
  string local_40;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_00203298;
  this->m_firstformat = true;
  this->m_firstpin = true;
  this->m_firstnail = true;
  std::_V2::system_category();
  std::filesystem::weakly_canonical(&directory,(error_code *)filepath);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::operator=(&directory,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  __locale = setlocale(1,"C");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"format.asc",&local_c1);
  bVar1 = load_and_parse(this,&directory,&local_c0._M_pathname,0x123c88);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"pins.asc",&local_c2);
    bVar1 = load_and_parse(this,&directory,&local_60,0x123cf6);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"nails.asc",&local_c3);
      bVar1 = load_and_parse(this,&directory,&local_40,0x12426a);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_c0);
      goto LAB_00124ea6;
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = false;
LAB_00124ea6:
  (this->super_BRDFileBase).valid = bVar1;
  update_counts(this);
  setlocale(1,__locale);
  std::filesystem::__cxx11::path::~path(&directory);
  return;
}

Assistant:

ASCFile::ASCFile(std::vector<char> &buf, const filesystem::path &filepath) {
	std::error_code ec;
	auto directory = filesystem::weakly_canonical(filepath, ec);
	if (ec) {
		error_msg = ec.message();
		return;
	}
	directory = directory.parent_path();

	char *saved_locale = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	if (!load_and_parse(directory, "format.asc", &ASCFile::parse_format)
		|| !load_and_parse(directory, "pins.asc", &ASCFile::parse_pin)
		|| !load_and_parse(directory, "nails.asc", &ASCFile::parse_nail)) {
		valid = false;
	} else {
		valid = true;
	}

	update_counts();
	setlocale(LC_NUMERIC, saved_locale); // Restore locale
}